

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

pointer gmlc::networking::TcpConnection::create
                  (SocketFactory *sf,io_context *io_context,string *connection,string *port,
                  size_t bufferSize)

{
  element_type *__f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  pointer pVar1;
  pointer *ptr;
  TcpConnection *in_stack_ffffffffffffff18;
  shared_ptr<gmlc::networking::TcpConnection> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  element_type *this_00;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  SocketFactory *in_stack_ffffffffffffff68;
  TcpConnection *in_stack_ffffffffffffff70;
  undefined1 local_88 [32];
  undefined1 local_68 [55];
  undefined1 local_31;
  
  local_31 = 0;
  this_00 = in_RDI;
  operator_new(0x240);
  TcpConnection(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                (io_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr<gmlc::networking::TcpConnection,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x6fba49);
  __f = std::__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x6fba55);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff58);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff58);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff48;
  std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)this,
             (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_ffffffffffffff18);
  std::function<void(std::error_code_const&)>::
  function<gmlc::networking::TcpConnection::create(gmlc::networking::SocketFactory_const&,asio::io_context&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::__0,void>
            ((function<void_(const_std::error_code_&)> *)this_00,(anon_class_16_1_ba1d6e4e *)__f);
  (*__f->_vptr_Socket[5])(__f,local_68,local_88,&stack0xffffffffffffff58);
  std::function<void_(const_std::error_code_&)>::~function
            ((function<void_(const_std::error_code_&)> *)0x6fbad6);
  create(gmlc::networking::SocketFactory_const&,asio::io_context&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)
  ::$_0::~__0((anon_class_16_1_ba1d6e4e *)0x6fbae0);
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string(this);
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (pointer)pVar1.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer TcpConnection::create(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& connection,
    const std::string& port,
    size_t bufferSize)
{
    auto ptr = pointer(new TcpConnection(sf, io_context, bufferSize));

    ptr->socket_->async_connect(
        connection, port, [ptr](const std::error_code& error) {
            ptr->connect_handler(error);
        });
    return ptr;
}